

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O2

BndryRegister * __thiscall amrex::BndryRegister::operator+=(BndryRegister *this,BndryRegister *rhs)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Orientation f;
  Array4<double> dfab;
  Array4<const_double> sfab;
  FabSetIter bfsi;
  long local_1a8;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    uVar1 = this->bndry[lVar2].m_mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
    FabSetIter::FabSetIter((FabSetIter *)&local_90,rhs->bndry + lVar2);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    while (local_90.currentIndex < local_90.endIndex) {
      MFIter::validbox(&local_12c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)(rhs->bndry + lVar2),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,(FabArray<amrex::FArrayBox> *)(this->bndry + lVar2),&local_90);
      lVar3 = (long)local_12c.smallend.vect[1];
      local_1a8 = 0;
      uVar4 = 0;
      while( true ) {
        lVar5 = (long)local_12c.smallend.vect[2];
        if (uVar4 == uVar1) break;
        for (; (int)lVar5 <= local_12c.bigend.vect[2]; lVar5 = lVar5 + 1) {
          lVar9 = (long)local_d0.p +
                  local_d0.nstride * local_1a8 +
                  (lVar3 - local_d0.begin.y) * local_d0.jstride * 8 +
                  (lVar5 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8 +
                  (long)local_12c.smallend.vect[0] * 8;
          lVar7 = (long)local_110.p +
                  local_110.nstride * local_1a8 +
                  (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
                  (lVar5 - local_110.begin.z) * local_110.kstride * 8 + (long)local_110.begin.x * -8
                  + (long)local_12c.smallend.vect[0] * 8;
          for (lVar6 = lVar3; lVar6 <= local_12c.bigend.vect[1]; lVar6 = lVar6 + 1) {
            if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
              lVar8 = 0;
              do {
                *(double *)(lVar7 + lVar8 * 8) =
                     *(double *)(lVar9 + lVar8 * 8) + *(double *)(lVar7 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar8);
            }
            lVar9 = lVar9 + local_d0.jstride * 8;
            lVar7 = lVar7 + local_110.jstride * 8;
          }
        }
        uVar4 = uVar4 + 1;
        local_1a8 = local_1a8 + 8;
      }
      MFIter::operator++(&local_90);
    }
    MFIter::~MFIter(&local_90);
  }
  return this;
}

Assistant:

BndryRegister&
BndryRegister::operator+= (const BndryRegister& rhs)
{
    BL_ASSERT(grids == rhs.grids);
    for (OrientationIter face; face; ++face) {
        const auto f = face();
        const int ncomp = bndry[f].nComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter bfsi(rhs[f]); bfsi.isValid(); ++bfsi) {
            const Box& bx = bfsi.validbox();
            auto const sfab =   rhs[f].array(bfsi);
            auto       dfab = bndry[f].array(bfsi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dfab(i,j,k,n) += sfab(i,j,k,n);
            });
        }
    }
    return *this;
}